

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum.c
# Opt level: O1

void aom_get_blk_sse_sum_c(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  int iVar5;
  
  *x_sum = 0;
  *x2_sum = 0;
  if (0 < bh) {
    iVar2 = 0;
    do {
      if (0 < bw) {
        iVar1 = *x_sum;
        iVar3 = *x2_sum;
        uVar4 = 0;
        do {
          iVar5 = (int)data[uVar4];
          iVar1 = iVar1 + iVar5;
          iVar3 = iVar3 + (ulong)(uint)(iVar5 * iVar5);
          uVar4 = uVar4 + 1;
        } while ((uint)bw != uVar4);
        *x_sum = iVar1;
        *x2_sum = iVar3;
      }
      iVar2 = iVar2 + 1;
      data = data + stride;
    } while (iVar2 != bh);
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_c(const int16_t *data, int stride, int bw, int bh,
                           int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;
  for (int i = 0; i < bh; ++i) {
    for (int j = 0; j < bw; ++j) {
      const int val = data[j];
      *x_sum += val;
      *x2_sum += val * val;
    }
    data += stride;
  }
}